

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

leveldb_filterpolicy_t * leveldb_filterpolicy_create_bloom(int bits_per_key)

{
  Wrapper *this;
  FilterPolicy *pFVar1;
  Wrapper *wrapper;
  int bits_per_key_local;
  
  this = (Wrapper *)operator_new(0x38);
  leveldb_filterpolicy_create_bloom::Wrapper::Wrapper(this);
  pFVar1 = leveldb::NewBloomFilterPolicy(bits_per_key);
  this->rep_ = pFVar1;
  (this->super_leveldb_filterpolicy_t).state_ = (void *)0x0;
  (this->super_leveldb_filterpolicy_t).destructor_ =
       leveldb_filterpolicy_create_bloom::Wrapper::DoNothing;
  return &this->super_leveldb_filterpolicy_t;
}

Assistant:

leveldb_filterpolicy_t* leveldb_filterpolicy_create_bloom(int bits_per_key) {
  // Make a leveldb_filterpolicy_t, but override all of its methods so
  // they delegate to a NewBloomFilterPolicy() instead of user
  // supplied C functions.
  struct Wrapper : public leveldb_filterpolicy_t {
    static void DoNothing(void*) {}

    ~Wrapper() { delete rep_; }
    const char* Name() const { return rep_->Name(); }
    void CreateFilter(const Slice* keys, int n, std::string* dst) const {
      return rep_->CreateFilter(keys, n, dst);
    }
    bool KeyMayMatch(const Slice& key, const Slice& filter) const {
      return rep_->KeyMayMatch(key, filter);
    }

    const FilterPolicy* rep_;
  };
  Wrapper* wrapper = new Wrapper;
  wrapper->rep_ = NewBloomFilterPolicy(bits_per_key);
  wrapper->state_ = nullptr;
  wrapper->destructor_ = &Wrapper::DoNothing;
  return wrapper;
}